

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void convert_32s2u_C1R(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  int local_44;
  int local_40;
  OPJ_UINT32 src2_1;
  OPJ_UINT32 src1_1;
  OPJ_UINT32 src0_1;
  OPJ_UINT32 src3;
  OPJ_UINT32 src2;
  OPJ_UINT32 src1;
  OPJ_UINT32 src0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_BYTE *pDst_local;
  OPJ_INT32 *pSrc_local;
  
  length_local = (OPJ_SIZE_T)pDst;
  for (_src1 = 0; _src1 < (length & 0xfffffffffffffffc); _src1 = _src1 + 4) {
    *(byte *)length_local =
         (byte)(pSrc[_src1] << 6) | (byte)(pSrc[_src1 + 1] << 4) | (byte)(pSrc[_src1 + 2] << 2) |
         (byte)pSrc[_src1 + 3];
    length_local = length_local + 1;
  }
  if ((length & 3) != 0) {
    local_40 = 0;
    local_44 = 0;
    if ((1 < (length & 3)) && (local_40 = pSrc[_src1 + 1], 2 < (length & 3))) {
      local_44 = pSrc[_src1 + 2];
    }
    *(byte *)length_local = (byte)(pSrc[_src1] << 6) | (byte)(local_40 << 4) | (byte)(local_44 << 2)
    ;
  }
  return;
}

Assistant:

static void convert_32s2u_C1R(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		
		*pDst++ = (OPJ_BYTE)((src0 << 6) | (src1 << 4) | (src2 << 2) | src3);
	}
	
	if (length & 3U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = 0U;
		OPJ_UINT32 src2 = 0U;
		length = length & 3U;
		
		if (length > 1U) {
			src1 = (OPJ_UINT32)pSrc[i+1];
			if (length > 2U) {
				src2 = (OPJ_UINT32)pSrc[i+2];
			}
		}
		*pDst++ = (OPJ_BYTE)((src0 << 6) | (src1 << 4) | (src2 << 2));
	}
}